

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

void __thiscall
duckdb::AsOfGlobalState::AsOfGlobalState(AsOfGlobalState *this,AsOfGlobalSinkState *gsink)

{
  vector<duckdb::OuterJoinMarker,_true> *this_00;
  pointer puVar1;
  reference this_01;
  pointer pPVar2;
  pointer this_02;
  OuterJoinMarker OStack_48;
  
  (this->super_GlobalOperatorState)._vptr_GlobalOperatorState =
       (_func_int **)&PTR__GlobalOperatorState_027b3348;
  this_00 = &gsink->right_outers;
  ::std::vector<duckdb::OuterJoinMarker,_std::allocator<duckdb::OuterJoinMarker>_>::reserve
            (&this_00->
              super_vector<duckdb::OuterJoinMarker,_std::allocator<duckdb::OuterJoinMarker>_>,
             (long)(gsink->rhs_sink).hash_groups.
                   super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(gsink->rhs_sink).hash_groups.
                   super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar1 = (gsink->rhs_sink).hash_groups.
           super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (gsink->rhs_sink).hash_groups.
                 super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar1; this_02 = this_02 + 1
      ) {
    OuterJoinMarker::OuterJoinMarker(&OStack_48,gsink->is_outer);
    ::std::vector<duckdb::OuterJoinMarker,_std::allocator<duckdb::OuterJoinMarker>_>::
    emplace_back<duckdb::OuterJoinMarker>
              (&this_00->
                super_vector<duckdb::OuterJoinMarker,_std::allocator<duckdb::OuterJoinMarker>_>,
               &OStack_48);
    ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
              (&OStack_48.found_match.super_unique_ptr<bool[],_std::default_delete<bool[]>_>);
    this_01 = vector<duckdb::OuterJoinMarker,_true>::back(this_00);
    pPVar2 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
             ::operator->(this_02);
    OuterJoinMarker::Initialize(this_01,(pPVar2->count).super___atomic_base<unsigned_long>._M_i);
  }
  return;
}

Assistant:

explicit AsOfGlobalState(AsOfGlobalSinkState &gsink) {
		// for FULL/RIGHT OUTER JOIN, initialize right_outers to false for every tuple
		auto &rhs_partition = gsink.rhs_sink;
		auto &right_outers = gsink.right_outers;
		right_outers.reserve(rhs_partition.hash_groups.size());
		for (const auto &hash_group : rhs_partition.hash_groups) {
			right_outers.emplace_back(OuterJoinMarker(gsink.is_outer));
			right_outers.back().Initialize(hash_group->count);
		}
	}